

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O3

void __thiscall
sorted_ptr_arr<double>::assign<std::vector<double,std::allocator<double>>>
          (sorted_ptr_arr<double> *this,vector<double,_std::allocator<double>_> *data)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  smoothsort_ptr<double> *__s;
  ulong uVar4;
  long lVar5;
  
  if (this->ptr_arr != (smoothsort_ptr<double> *)0x0) {
    operator_delete__(this->ptr_arr);
  }
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)pdVar2 - (long)pdVar1;
  uVar4 = (long)uVar3 >> 3;
  this->N = uVar4;
  __s = (smoothsort_ptr<double> *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar3);
  lVar5 = (long)pdVar2 - (long)pdVar1;
  if (lVar5 != 0) {
    memset(__s,0,(lVar5 - 8U & 0xfffffffffffffff8) + 8);
  }
  this->ptr_arr = __s;
  sort(this);
  return;
}

Assistant:

void assign(TContainer &data) {
		if(ptr_arr != NULL) { delete[] ptr_arr; }
		N = data.size();
		ptr_arr = new smoothsort_ptr<T>[N];
		typename TContainer::iterator it_end = data.end();
		unsigned int i=0;
		for(typename TContainer::iterator it = data.begin(); it != it_end; ++it) {
			if(i == N) { break; }
			ptr_arr[i] = &(*it);
			i++;
		}
		sort();
	}